

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

bool __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::extract_block
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,color_quad<unsigned_char,_int> *pDst
          ,uint x,uint y,uint w,uint h,bool flip_xy)

{
  color_quad<unsigned_char,_int> *pcVar1;
  uint local_54;
  color_quad<unsigned_char,_int> *pcStack_50;
  uint i;
  color_quad<unsigned_char,_int> *pSrc;
  uint local_40;
  uint x_ofs_1;
  uint y_ofs_1;
  uint x_ofs;
  uint y_ofs;
  bool flip_xy_local;
  uint h_local;
  uint w_local;
  uint y_local;
  uint x_local;
  color_quad<unsigned_char,_int> *pDst_local;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  if ((x < this->m_width) && (y < this->m_height)) {
    if (flip_xy) {
      for (y_ofs_1 = 0; y_ofs_1 < h; y_ofs_1 = y_ofs_1 + 1) {
        for (x_ofs_1 = 0; x_ofs_1 < w; x_ofs_1 = x_ofs_1 + 1) {
          pcVar1 = get_clamped(this,x_ofs_1 + x,y_ofs_1 + y);
          color_quad<unsigned_char,_int>::operator=(pDst + (x_ofs_1 * h + y_ofs_1),pcVar1);
        }
      }
    }
    else {
      _y_local = pDst;
      if ((this->m_width < x + w) || (this->m_height < y + h)) {
        for (local_40 = 0; local_40 < h; local_40 = local_40 + 1) {
          for (pSrc._4_4_ = 0; pSrc._4_4_ < w; pSrc._4_4_ = pSrc._4_4_ + 1) {
            pcVar1 = get_clamped(this,pSrc._4_4_ + x,local_40 + y);
            color_quad<unsigned_char,_int>::operator=(_y_local,pcVar1);
            _y_local = _y_local + 1;
          }
        }
      }
      else {
        pcStack_50 = get_scanline(this,y);
        pcStack_50 = pcStack_50 + x;
        for (local_54 = h; local_54 != 0; local_54 = local_54 - 1) {
          memcpy(_y_local,pcStack_50,(ulong)w << 2);
          _y_local = _y_local + w;
          pcStack_50 = pcStack_50 + this->m_pitch;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool extract_block(color_type* pDst, uint x, uint y, uint w, uint h, bool flip_xy = false) const
        {
            if ((x >= m_width) || (y >= m_height))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (flip_xy)
            {
                for (uint y_ofs = 0; y_ofs < h; y_ofs++)
                {
                    for (uint x_ofs = 0; x_ofs < w; x_ofs++)
                    {
                        pDst[x_ofs * h + y_ofs] = get_clamped(x_ofs + x, y_ofs + y); // 5/4/12 - this was incorrectly x_ofs * 4
                    }
                }
            }
            else if (((x + w) > m_width) || ((y + h) > m_height))
            {
                for (uint y_ofs = 0; y_ofs < h; y_ofs++)
                {
                    for (uint x_ofs = 0; x_ofs < w; x_ofs++)
                    {
                        *pDst++ = get_clamped(x_ofs + x, y_ofs + y);
                    }
                }
            }
            else
            {
                const color_type* pSrc = get_scanline(y) + x;

                for (uint i = h; i; i--)
                {
                    memcpy(pDst, pSrc, w * sizeof(color_type));
                    pDst += w;

                    pSrc += m_pitch;
                }
            }

            return true;
        }